

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.cpp
# Opt level: O2

void __thiscall OpenMD::TorsionStamp::~TorsionStamp(TorsionStamp *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__TorsionStamp_002017a8;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->orPars_).super__Vector_base<double,_std::allocator<double>_>);
  std::__cxx11::string::~string((string *)&this->orType_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->members_).super__Vector_base<int,_std::allocator<int>_>);
  ParameterBase::~ParameterBase(&(this->GhostVectorSource).super_ParameterBase);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

TorsionStamp::~TorsionStamp() {}